

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

void sai_terminate_sparse_arrays(void)

{
  Integer ga;
  Integer i;
  long local_8;
  
  for (local_8 = 0; local_8 < 0x8000; local_8 = local_8 + 1) {
    if (GA[SPA[local_8].g_data + 1000].actv == 1) {
      pnga_destroy(ga);
    }
    if (GA[SPA[local_8].g_i + 1000].actv == 1) {
      pnga_destroy(ga);
    }
    if (GA[SPA[local_8].g_j + 1000].actv == 1) {
      pnga_destroy(ga);
    }
    if (SPA[local_8].blkidx != (Integer *)0x0) {
      free(SPA[local_8].blkidx);
    }
    if (SPA[local_8].blksize != (Integer *)0x0) {
      free(SPA[local_8].blksize);
    }
    if (SPA[local_8].offset != (Integer *)0x0) {
      free(SPA[local_8].offset);
    }
    if (SPA[local_8].idx != (Integer *)0x0) {
      free(SPA[local_8].idx);
    }
    if (SPA[local_8].jdx != (Integer *)0x0) {
      free(SPA[local_8].jdx);
    }
    if (SPA[local_8].val != (void *)0x0) {
      free(SPA[local_8].val);
    }
  }
  free(SPA);
  return;
}

Assistant:

void sai_terminate_sparse_arrays()
{
  Integer i;
  for (i=0; i<MAX_ARRAYS; i++) {
    Integer ga = SPA[i].g_data + GA_OFFSET;
    if (GA[ga].actv==1) pnga_destroy(SPA[i].g_data);
    ga = SPA[i].g_i + GA_OFFSET;
    if (GA[ga].actv==1) pnga_destroy(SPA[i].g_i);
    ga = SPA[i].g_j + GA_OFFSET;
    if (GA[ga].actv==1) pnga_destroy(SPA[i].g_j);
    if (SPA[i].blkidx) free(SPA[i].blkidx);
    if (SPA[i].blksize) free(SPA[i].blksize);
    if (SPA[i].offset) free(SPA[i].offset);
    if (SPA[i].idx) free(SPA[i].idx);
    if (SPA[i].jdx) free(SPA[i].jdx);
    if (SPA[i].val) free(SPA[i].val);
  }
  free(SPA);
}